

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O2

int MRIStepInnerStepper_Free(MRIStepInnerStepper *stepper)

{
  if (*stepper != (MRIStepInnerStepper)0x0) {
    mriStepInnerStepper_FreeVecs(*stepper);
    free((*stepper)->ops);
    free(*stepper);
    *stepper = (MRIStepInnerStepper)0x0;
  }
  return 0;
}

Assistant:

int MRIStepInnerStepper_Free(MRIStepInnerStepper* stepper)
{
  if (*stepper == NULL) { return ARK_SUCCESS; }

  /* free the inner forcing and fused op workspace vector */
  mriStepInnerStepper_FreeVecs(*stepper);

  /* free operations structure */
  free((*stepper)->ops);

  /* free inner stepper mem */
  free(*stepper);
  *stepper = NULL;

  return (ARK_SUCCESS);
}